

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O0

int is(atom a,atom b)

{
  int iVar1;
  anon_union_8_9_1d3277aa_for_value aVar2;
  anon_union_8_9_1d3277aa_for_value aVar3;
  atom b_local;
  atom a_local;
  
  aVar2 = b.value;
  aVar3 = a.value;
  if (a.type == b.type) {
    switch(a.type) {
    case T_NIL:
      a_local.value._4_4_ = 1;
      break;
    case T_CONS:
    case T_CLOSURE:
    case T_MACRO:
      a_local.value._4_4_ = ZEXT14(aVar3.pair == aVar2.pair);
      break;
    case T_SYM:
      a_local.value._4_4_ = ZEXT14(aVar3.pair == aVar2.pair);
      break;
    case T_NUM:
      a_local.value._4_4_ = ZEXT14(aVar3.number == aVar2.number);
      break;
    case T_BUILTIN:
      a_local.value._4_4_ = ZEXT14(aVar3.pair == aVar2.pair);
      break;
    case T_STRING:
      iVar1 = strcmp((aVar3.str)->value,*(char **)&(aVar2.str)->value);
      a_local.value._4_4_ = ZEXT14(iVar1 == 0);
      break;
    case T_INPUT:
    case T_INPUT_PIPE:
    case T_OUTPUT:
      a_local.value._4_4_ = ZEXT14(aVar3.pair == aVar2.pair);
      break;
    case T_TABLE:
      a_local.value._4_4_ = ZEXT14(aVar3.pair == aVar2.pair);
      break;
    case T_CHAR:
      a_local.type._0_1_ = a.value._0_1_;
      b_local.type._0_1_ = b.value._0_1_;
      a_local.value._4_4_ = ZEXT14((undefined1)a_local.type == (undefined1)b_local.type);
      break;
    case T_CONTINUATION:
      a_local.value._4_4_ = ZEXT14(aVar3.pair == aVar2.pair);
      break;
    default:
      goto switchD_00106b35_default;
    }
  }
  else {
switchD_00106b35_default:
    a_local.value._4_4_ = 0;
  }
  return a_local.value._4_4_;
}

Assistant:

int is(atom a, atom b) {
	if (a.type == b.type) {
		switch (a.type) {
		case T_NIL:
			return 1;
		case T_CONS:
		case T_CLOSURE:
		case T_MACRO:
			return (a.value.pair == b.value.pair);
		case T_SYM:
			return (a.value.symbol == b.value.symbol);
		case T_NUM:
			return (a.value.number == b.value.number);
		case T_BUILTIN:
			return (a.value.builtin == b.value.builtin);
		case T_STRING:
			return strcmp(a.value.str->value, b.value.str->value) == 0;
		case T_CHAR:
			return (a.value.ch == b.value.ch);
		case T_TABLE:
			return a.value.table == b.value.table;
		case T_INPUT:
		case T_INPUT_PIPE:
		case T_OUTPUT:
			return a.value.fp == b.value.fp;
		case T_CONTINUATION:
			return a.value.jb == b.value.jb;
		}
	}
	return 0;
}